

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::UpdateKeyboardInputs(void)

{
  ImGuiContext *pIVar1;
  ImGuiKeyModFlags IVar2;
  ImGuiKeyData *pIVar3;
  ImGuiKeyData *key_data;
  int i_1;
  int i;
  ImGuiKey key;
  int n_3;
  int n_2;
  int n_1;
  int n;
  ImGuiIO *io;
  ImGuiContext *g;
  float local_44;
  float local_40;
  int local_3c;
  int local_2c;
  int local_28;
  int local_20;
  int local_1c;
  int local_18;
  int local_14;
  
  pIVar1 = GImGui;
  if ((GImGui->IO).BackendUsingLegacyKeyArrays == '\0') {
    for (local_14 = 0; local_14 < 0x200; local_14 = local_14 + 1) {
    }
  }
  else {
    if (GImGui->FrameCount == 0) {
      for (local_18 = 0; local_18 < 0x200; local_18 = local_18 + 1) {
      }
    }
    for (local_1c = 0x200; local_1c < 0x285; local_1c = local_1c + 1) {
      if ((pIVar1->IO).KeyMap[local_1c] != -1) {
        (pIVar1->IO).KeyMap[(pIVar1->IO).KeyMap[local_1c]] = local_1c;
      }
    }
    for (local_20 = 0; local_20 < 0x200; local_20 = local_20 + 1) {
      if ((((pIVar1->IO).KeysDown[local_20] & 1U) != 0) ||
         ((pIVar1->IO).BackendUsingLegacyKeyArrays == '\x01')) {
        if ((pIVar1->IO).KeyMap[local_20] == -1) {
          local_3c = local_20;
        }
        else {
          local_3c = (pIVar1->IO).KeyMap[local_20];
        }
        (pIVar1->IO).KeysData[local_3c].Down = (bool)((pIVar1->IO).KeysDown[local_20] & 1);
        if (local_3c != local_20) {
          (pIVar1->IO).KeysDown[local_3c] = (bool)((pIVar1->IO).KeysDown[local_20] & 1);
        }
        (pIVar1->IO).BackendUsingLegacyKeyArrays = '\x01';
      }
    }
    if ((pIVar1->IO).BackendUsingLegacyKeyArrays == '\x01') {
      (pIVar1->IO).KeysData[0x281].Down = (bool)((pIVar1->IO).KeyCtrl & 1);
      (pIVar1->IO).KeysData[0x282].Down = (bool)((pIVar1->IO).KeyShift & 1);
      (pIVar1->IO).KeysData[0x283].Down = (bool)((pIVar1->IO).KeyAlt & 1);
      (pIVar1->IO).KeysData[0x284].Down = (bool)((pIVar1->IO).KeySuper & 1);
    }
  }
  IVar2 = GetMergedKeyModFlags();
  (pIVar1->IO).KeyMods = IVar2;
  if (((pIVar1->IO).BackendFlags & 1U) == 0) {
    for (local_28 = 0x269; local_28 < 0x281; local_28 = local_28 + 1) {
      (pIVar1->IO).KeysData[local_28].Down = false;
      (pIVar1->IO).KeysData[local_28].AnalogValue = 0.0;
    }
  }
  for (local_2c = 0; local_2c < 0x285; local_2c = local_2c + 1) {
    pIVar3 = (pIVar1->IO).KeysData + local_2c;
    pIVar3->DownDurationPrev = pIVar3->DownDuration;
    if ((pIVar3->Down & 1U) == 0) {
      local_44 = -1.0;
    }
    else {
      if (0.0 < pIVar3->DownDuration || pIVar3->DownDuration == 0.0) {
        local_40 = pIVar3->DownDuration + (pIVar1->IO).DeltaTime;
      }
      else {
        local_40 = 0.0;
      }
      local_44 = local_40;
    }
    pIVar3->DownDuration = local_44;
  }
  return;
}

Assistant:

static void ImGui::UpdateKeyboardInputs()
{
    ImGuiContext& g = *GImGui;
    ImGuiIO& io = g.IO;

    // Import legacy keys or verify they are not used
#ifndef IMGUI_DISABLE_OBSOLETE_KEYIO
    if (io.BackendUsingLegacyKeyArrays == 0)
    {
        // Backend used new io.AddKeyEvent() API: Good! Verify that old arrays are never written to externally.
        for (int n = 0; n < ImGuiKey_LegacyNativeKey_END; n++)
            IM_ASSERT((io.KeysDown[n] == false || IsKeyDown(n)) && "Backend needs to either only use io.AddKeyEvent(), either only fill legacy io.KeysDown[] + io.KeyMap[]. Not both!");
    }
    else
    {
        if (g.FrameCount == 0)
            for (int n = ImGuiKey_LegacyNativeKey_BEGIN; n < ImGuiKey_LegacyNativeKey_END; n++)
                IM_ASSERT(g.IO.KeyMap[n] == -1 && "Backend is not allowed to write to io.KeyMap[0..511]!");

        // Build reverse KeyMap (Named -> Legacy)
        for (int n = ImGuiKey_NamedKey_BEGIN; n < ImGuiKey_NamedKey_END; n++)
            if (io.KeyMap[n] != -1)
            {
                IM_ASSERT(IsLegacyKey((ImGuiKey)io.KeyMap[n]));
                io.KeyMap[io.KeyMap[n]] = n;
            }

        // Import legacy keys into new ones
        for (int n = ImGuiKey_LegacyNativeKey_BEGIN; n < ImGuiKey_LegacyNativeKey_END; n++)
            if (io.KeysDown[n] || io.BackendUsingLegacyKeyArrays == 1)
            {
                const ImGuiKey key = (ImGuiKey)(io.KeyMap[n] != -1 ? io.KeyMap[n] : n);
                IM_ASSERT(io.KeyMap[n] == -1 || IsNamedKey(key));
                io.KeysData[key].Down = io.KeysDown[n];
                if (key != n)
                    io.KeysDown[key] = io.KeysDown[n]; // Allow legacy code using io.KeysDown[GetKeyIndex()] with old backends
                io.BackendUsingLegacyKeyArrays = 1;
            }
        if (io.BackendUsingLegacyKeyArrays == 1)
        {
            io.KeysData[ImGuiKey_ModCtrl].Down = io.KeyCtrl;
            io.KeysData[ImGuiKey_ModShift].Down = io.KeyShift;
            io.KeysData[ImGuiKey_ModAlt].Down = io.KeyAlt;
            io.KeysData[ImGuiKey_ModSuper].Down = io.KeySuper;
        }
    }
#endif

    // Synchronize io.KeyMods with individual modifiers io.KeyXXX bools
    io.KeyMods = GetMergedKeyModFlags();

    // Clear gamepad data if disabled
    if ((io.BackendFlags & ImGuiBackendFlags_HasGamepad) == 0)
        for (int i = ImGuiKey_Gamepad_BEGIN; i < ImGuiKey_Gamepad_END; i++)
        {
            io.KeysData[i - ImGuiKey_KeysData_OFFSET].Down = false;
            io.KeysData[i - ImGuiKey_KeysData_OFFSET].AnalogValue = 0.0f;
        }

    // Update keys
    for (int i = 0; i < IM_ARRAYSIZE(io.KeysData); i++)
    {
        ImGuiKeyData& key_data = io.KeysData[i];
        key_data.DownDurationPrev = key_data.DownDuration;
        key_data.DownDuration = key_data.Down ? (key_data.DownDuration < 0.0f ? 0.0f : key_data.DownDuration + io.DeltaTime) : -1.0f;
    }
}